

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VConstrMask(N_Vector C,N_Vector X,N_Vector M,sunindextype local_length,int myid)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  undefined8 in_RDX;
  N_Vector in_RSI;
  undefined8 in_RDI;
  uint in_R8D;
  N_Vector X_00;
  double dVar3;
  double dVar4;
  sunrealtype sVar5;
  int test;
  sunindextype i;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  sunrealtype in_stack_ffffffffffffff90;
  N_Vector in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  sunrealtype local_58;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar6;
  int local_30;
  int local_4;
  
  local_30 = 0;
  uVar6 = 0;
  if (in_RCX < 7) {
    printf("Error Test_N_VConstrMask: Local vector length is %ld, length must be >= 7\n",in_RCX);
    local_4 = 1;
  }
  else {
    for (local_58 = 0.0; (long)local_58 < in_RCX; local_58 = (sunrealtype)((long)local_58 + 1)) {
      set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff98 = (N_Vector)((long)local_58 % 7);
      in_stack_ffffffffffffff90 = local_58;
      switch(in_stack_ffffffffffffff98) {
      case (N_Vector)0x0:
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,local_58);
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        break;
      case (N_Vector)0x1:
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,local_58);
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        break;
      case (N_Vector)0x2:
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,local_58);
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        break;
      case (N_Vector)0x3:
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,local_58);
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        break;
      case (N_Vector)0x4:
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,local_58);
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        break;
      case (N_Vector)0x5:
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,local_58);
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        break;
      case (N_Vector)0x6:
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,local_58);
        set_element((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
    }
    X_00 = (N_Vector)get_time();
    iVar1 = N_VConstrMask(in_RDI,in_RSI,in_RDX);
    sync_device(in_RSI);
    dVar3 = get_time();
    iVar2 = check_ans((sunrealtype)CONCAT44(uVar6,in_stack_ffffffffffffffc8),X_00,
                      (sunindextype)dVar3);
    if ((iVar2 == 0) && (iVar1 != 0)) {
      if (in_R8D == 0) {
        printf("PASSED test -- N_VConstrMask Case 1 \n");
      }
    }
    else {
      printf(">>> FAILED test -- N_VConstrMask Case 1, Proc %d \n",(ulong)in_R8D);
      local_30 = 1;
    }
    dVar3 = max_time(in_RSI,dVar3 - (double)X_00);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n",dVar3,"N_VConstrMask");
    }
    iVar2 = 0;
    for (local_58 = 0.0; (long)local_58 < in_RCX; local_58 = (sunrealtype)((long)local_58 + 1)) {
      set_element((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                  (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      switch((long)local_58 % 5) {
      case 0:
        set_element((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        set_element((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        break;
      case 1:
        set_element((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        set_element((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        break;
      case 2:
        set_element((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        set_element((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        break;
      case 3:
        set_element((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        set_element((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        break;
      case 4:
        set_element((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        set_element((N_Vector)CONCAT44(iVar1,in_stack_ffffffffffffffa0),
                    (sunindextype)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
    }
    dVar3 = get_time();
    iVar1 = N_VConstrMask(in_RDI,in_RSI,in_RDX);
    sync_device(in_RSI);
    dVar4 = get_time();
    for (local_58 = 0.0; (long)local_58 < in_RCX; local_58 = (sunrealtype)((long)local_58 + 1)) {
      if ((long)local_58 % 5 == 2) {
        sVar5 = get_element(in_stack_ffffffffffffff98,(sunindextype)in_stack_ffffffffffffff90);
        if ((sVar5 != 0.0) || (NAN(sVar5))) {
          iVar2 = 1;
        }
      }
      else {
        sVar5 = get_element(in_stack_ffffffffffffff98,(sunindextype)in_stack_ffffffffffffff90);
        if ((sVar5 != 1.0) || (NAN(sVar5))) {
          iVar2 = 1;
        }
      }
    }
    if ((iVar2 == 0) && (iVar1 == 0)) {
      if (in_R8D == 0) {
        printf("PASSED test -- N_VConstrMask Case 2 \n");
      }
    }
    else {
      printf(">>> FAILED test -- N_VConstrMask Case 2, Proc %d \n",(ulong)in_R8D);
      local_30 = local_30 + 1;
    }
    dVar3 = max_time(in_RSI,dVar4 - dVar3);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n",dVar3,"N_VConstrMask");
    }
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

int Test_N_VConstrMask(N_Vector C, N_Vector X, N_Vector M,
                       sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype i;
  sunbooleantype test;

  if (local_length < 7)
  {
    printf("Error Test_N_VConstrMask: Local vector length is %ld, length must "
           "be >= 7\n",
           (long int)local_length);
    return (1);
  }

  /*
   * Case 1: Return True
   */

  /* fill vector data */
  for (i = 0; i < local_length; i++)
  {
    set_element(M, i, NEG_ONE);

    switch (i % 7)
    {
    case 0:
      /* c = -2, test for < 0*/
      set_element(C, i, NEG_TWO);
      set_element(X, i, NEG_TWO);
      break;

    case 1:
      /* c = -1, test for <= 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, NEG_ONE);
      break;

    case 2:
      /* c = -1, test for == 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, ZERO);
      break;

    case 3:
      /* c = 0, no test */
      set_element(C, i, ZERO);
      set_element(X, i, HALF);
      break;

    case 4:
      /* c = 1, test for == 0*/
      set_element(C, i, ONE);
      set_element(X, i, ZERO);
      break;

    case 5:
      /* c = 1, test for >= 0*/
      set_element(C, i, ONE);
      set_element(X, i, ONE);
      break;

    case 6:
      /* c = 2, test for > 0 */
      set_element(C, i, TWO);
      set_element(X, i, TWO);
      break;
    }
  }

  start_time = get_time();
  test       = N_VConstrMask(C, X, M);
  sync_device(X);
  stop_time = get_time();

  /* M should be vector of 0 */
  failure = check_ans(ZERO, M, local_length);

  if (failure || !test)
  {
    printf(">>> FAILED test -- N_VConstrMask Case 1, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VConstrMask Case 1 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VConstrMask", maxt);

  /*
   * Case 2: Return False
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  for (i = 0; i < local_length; i++)
  {
    set_element(M, i, NEG_ONE);

    switch (i % 5)
    {
    case 0:
      /* c = -2, test for < 0*/
      set_element(C, i, NEG_TWO);
      set_element(X, i, TWO);
      break;

    case 1:
      /* c = -1, test for <= 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, ONE);
      break;

    case 2:
      /* c = 0, no test */
      set_element(C, i, ZERO);
      set_element(X, i, HALF);
      break;

    case 3:
      /* c = 1, test for >= 0*/
      set_element(C, i, ONE);
      set_element(X, i, NEG_ONE);
      break;

    case 4:
      /* c = 2, test for > 0 */
      set_element(C, i, TWO);
      set_element(X, i, NEG_TWO);
      break;
    }
  }

  start_time = get_time();
  test       = N_VConstrMask(C, X, M);
  sync_device(X);
  stop_time = get_time();

  /* check mask vector */
  for (i = 0; i < local_length; i++)
  {
    if ((i % 5) == 2)
    {
      if (get_element(M, i) != ZERO) { failure = 1; }
    }
    else
    {
      if (get_element(M, i) != ONE) { failure = 1; }
    }
  }

  if (failure || test)
  {
    printf(">>> FAILED test -- N_VConstrMask Case 2, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VConstrMask Case 2 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VConstrMask", maxt);

  return (fails);
}